

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestRunner.cpp
# Opt level: O1

void glcts::getBaseOptions
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,string *mustpassDir,string *apiName,string *configName,string *screenRotation,
               int width,int height)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  string case_list_option;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  ulong *local_290;
  long local_288;
  ulong local_280;
  long lStack_278;
  ulong *local_270;
  long local_268;
  ulong local_260;
  long lStack_258;
  int local_24c;
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  value_type local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  pcVar3 = (mustpassDir->_M_dataplus)._M_p;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar3,pcVar3 + mustpassDir->_M_string_length);
  local_228[0] = local_218;
  pcVar3 = (apiName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_228,pcVar3,pcVar3 + apiName->_M_string_length);
  local_248[0] = local_238;
  pcVar3 = (configName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_248,pcVar3,pcVar3 + configName->_M_string_length);
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  local_2b0._M_dataplus._M_p = (pointer)0x15;
  local_1a8[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_1a8,(ulong)&local_2b0);
  local_1a8[0].field_2._M_allocated_capacity = local_2b0._M_dataplus._M_p;
  builtin_strncpy(local_1a8[0]._M_dataplus._M_p,"--deqp-caselist-file=",0x15);
  local_1a8[0]._M_string_length = (size_type)local_2b0._M_dataplus._M_p;
  local_1a8[0]._M_dataplus._M_p[(long)local_2b0._M_dataplus._M_p] = '\0';
  std::operator+(&local_1c8,local_1a8,&local_1e8);
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_228[0]);
  local_290 = &local_280;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_280 = *puVar6;
    lStack_278 = plVar4[3];
  }
  else {
    local_280 = *puVar6;
    local_290 = (ulong *)*plVar4;
  }
  local_288 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_290);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_260 = *puVar6;
    lStack_258 = plVar4[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *puVar6;
    local_270 = (ulong *)*plVar4;
  }
  local_268 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_24c = width;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_248[0]);
  paVar1 = &local_2b0.field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2b0.field_2._M_allocated_capacity = *psVar7;
    local_2b0.field_2._8_8_ = plVar4[3];
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = *psVar7;
    local_2b0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_2b0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_208.field_2._M_allocated_capacity = *psVar7;
    local_208.field_2._8_8_ = plVar4[3];
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar7;
    local_208._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_208._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,
                    (ulong)(local_1a8[0].field_2._M_allocated_capacity + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(args,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  if (local_228[0] != local_218) {
    operator_delete(local_228[0],local_218[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_2b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"--deqp-screen-rotation=","")
  ;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2b0,(ulong)(screenRotation->_M_dataplus)._M_p);
  paVar2 = &local_1a8[0].field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_1a8[0].field_2._0_8_ = *psVar7;
    local_1a8[0].field_2._8_8_ = plVar4[3];
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1a8[0].field_2._0_8_ = *psVar7;
    local_1a8[0]._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_1a8[0]._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  local_270 = &local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"--deqp-surface-width=","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,local_24c);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar8 = 0xf;
  if (local_270 != &local_260) {
    uVar8 = local_260;
  }
  if (uVar8 < (ulong)(local_288 + local_268)) {
    uVar8 = 0xf;
    if (local_290 != &local_280) {
      uVar8 = local_280;
    }
    if (uVar8 < (ulong)(local_288 + local_268)) goto LAB_0084c654;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_270);
  }
  else {
LAB_0084c654:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_290);
  }
  psVar7 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2b0.field_2._M_allocated_capacity = *psVar7;
    local_2b0.field_2._8_8_ = puVar5[3];
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = *psVar7;
    local_2b0._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_2b0._M_string_length = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)psVar7 = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  local_270 = &local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"--deqp-surface-height=","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,height);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar8 = 0xf;
  if (local_270 != &local_260) {
    uVar8 = local_260;
  }
  if (uVar8 < (ulong)(local_288 + local_268)) {
    uVar8 = 0xf;
    if (local_290 != &local_280) {
      uVar8 = local_280;
    }
    if ((ulong)(local_288 + local_268) <= uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_270);
      goto LAB_0084c7d5;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_290);
LAB_0084c7d5:
  psVar7 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2b0.field_2._M_allocated_capacity = *psVar7;
    local_2b0.field_2._8_8_ = puVar5[3];
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = *psVar7;
    local_2b0._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_2b0._M_string_length = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)psVar7 = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"--deqp-watchdog=disable","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void getBaseOptions(std::vector<std::string>& args, const string mustpassDir, const string apiName,
						   const string configName, const string screenRotation, int width, int height)
{
	args.push_back(getCaseListFileOption(mustpassDir, apiName, configName));
	args.push_back(string("--deqp-screen-rotation=") + screenRotation);
	args.push_back(string("--deqp-surface-width=") + de::toString(width));
	args.push_back(string("--deqp-surface-height=") + de::toString(height));
	args.push_back("--deqp-watchdog=disable");
}